

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O0

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::Plan::getLSBeamlet(Plan *this,int bsize,int vsize)

{
  pair<bool,_std::pair<imrt::Station_*,_int>_> *in_RDI;
  iterator it;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  int in_stack_00000144;
  int in_stack_00000148;
  int in_stack_0000014c;
  Plan *in_stack_00000150;
  EvaluationFunction *in_stack_00000158;
  pair<imrt::Station_*,_int> *in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
  *p_Var1;
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
  local_48;
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
  local_40 [8];
  
  p_Var1 = local_40;
  EvaluationFunction::best_beamlets
            (in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_00000148,
             in_stack_00000144);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
       ::begin((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                *)in_stack_ffffffffffffff68);
  rand();
  std::
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::size((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
          *)0x11c32e);
  std::
  advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,unsigned_long>
            (p_Var1,(unsigned_long)in_RDI);
  p_Var1 = &local_48;
  std::
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>::
  operator->(p_Var1);
  std::
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>::
  operator->(p_Var1);
  std::make_pair<bool_const&,std::pair<imrt::Station*,int>const&>
            ((bool *)p_Var1,in_stack_ffffffffffffff68);
  std::
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~set((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
          *)0x11c390);
  return in_RDI;
}

Assistant:

virtual pair<bool, pair<Station*, int>> getLSBeamlet(int bsize, int vsize){
		  auto sb=ev.best_beamlets(*this, bsize, vsize);
		  auto it=sb.begin();
		  std::advance(it,rand()%sb.size());
		  return make_pair(it->first.second, it->second);
	}